

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O3

sds duckdb_hll::sdscatrepr(sds s,char *p,size_t len)

{
  byte bVar1;
  int iVar2;
  sds pcVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  
  pcVar3 = sdscatlen(s,"\"",1);
  if (len != 0) {
    sVar6 = 0;
    do {
      bVar1 = p[sVar6];
      switch(bVar1) {
      case 7:
        pcVar5 = "\\a";
        break;
      case 8:
        pcVar5 = "\\b";
        break;
      case 9:
        pcVar5 = "\\t";
        break;
      case 10:
        pcVar5 = "\\n";
        break;
      case 0xb:
      case 0xc:
switchD_0184ff0d_caseD_b:
        iVar2 = isprint((int)(char)bVar1);
        if (iVar2 != 0) {
          pcVar5 = "%c";
          goto LAB_0184ff4d;
        }
        uVar4 = (ulong)bVar1;
        pcVar5 = "\\x%02x";
        goto LAB_0184ff4f;
      case 0xd:
        pcVar5 = "\\r";
        break;
      default:
        if ((bVar1 != 0x5c) && (bVar1 != 0x22)) goto switchD_0184ff0d_caseD_b;
        pcVar5 = "\\%c";
LAB_0184ff4d:
        uVar4 = (ulong)(uint)(int)(char)bVar1;
LAB_0184ff4f:
        pcVar3 = sdscatprintf(pcVar3,pcVar5,uVar4);
        goto LAB_0184ff9f;
      }
      pcVar3 = sdscatlen(pcVar3,pcVar5,2);
LAB_0184ff9f:
      sVar6 = sVar6 + 1;
    } while (len != sVar6);
  }
  pcVar3 = sdscatlen(pcVar3,"\"",1);
  return pcVar3;
}

Assistant:

sds sdscatrepr(sds s, const char *p, size_t len) {
    s = sdscatlen(s,"\"",1);
    while(len--) {
        switch(*p) {
        case '\\':
        case '"':
            s = sdscatprintf(s,"\\%c",*p);
            break;
        case '\n': s = sdscatlen(s,"\\n",2); break;
        case '\r': s = sdscatlen(s,"\\r",2); break;
        case '\t': s = sdscatlen(s,"\\t",2); break;
        case '\a': s = sdscatlen(s,"\\a",2); break;
        case '\b': s = sdscatlen(s,"\\b",2); break;
        default:
            if (isprint(*p))
                s = sdscatprintf(s,"%c",*p);
            else
                s = sdscatprintf(s,"\\x%02x",(unsigned char)*p);
            break;
        }
        p++;
    }
    return sdscatlen(s,"\"",1);
}